

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetPchSource
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  cmGeneratorTarget *this_01;
  mapped_type *pmVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  _Base_ptr destination;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *psVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  string filename_tmp;
  string pchHeader;
  cmGeneratedFileStream file;
  undefined1 local_350 [48];
  _Base_ptr local_320;
  _Base_ptr local_318;
  string *local_310;
  string local_308;
  string local_2e8;
  string *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  size_type local_2a0;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  string *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8 [6];
  
  iVar2 = std::__cxx11::string::compare((char *)language);
  if ((((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)language), iVar2 != 0)) &&
      (iVar2 = std::__cxx11::string::compare((char *)language), iVar2 != 0)) &&
     (iVar2 = std::__cxx11::string::compare((char *)language), iVar2 != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_310 = __return_storage_ptr__;
  std::operator+(&local_2c0,language,config);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2c0,(ulong)(arch->_M_dataplus)._M_p);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_350 + 0x10);
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar5) {
    local_350._16_8_ = paVar5->_M_allocated_capacity;
    local_350._24_8_ = plVar3[3];
    local_350._0_8_ = paVar8;
  }
  else {
    local_350._16_8_ = paVar5->_M_allocated_capacity;
    local_350._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar3;
  }
  local_298._8_8_ = plVar3[1];
  *plVar3 = (long)paVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ == paVar8) {
    local_288._8_8_ = local_350._24_8_;
    local_298._0_8_ = &local_288;
  }
  else {
    local_298._0_8_ = local_350._0_8_;
  }
  local_288._M_allocated_capacity = local_350._16_8_;
  local_350._8_8_ = 0;
  local_350._16_8_ = local_350._16_8_ & 0xffffffffffffff00;
  local_278._M_p = "";
  local_350._0_8_ = paVar8;
  pVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->PchSources,
                      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                       *)local_298);
  local_320 = (_Base_ptr)pVar10.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_350 + 0x10)) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  psVar9 = local_310;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    GetPchHeader(&local_2c0,this,config,language,arch);
    if (local_2c0._M_string_length == 0) {
      (local_310->_M_dataplus)._M_p = (pointer)&local_310->field_2;
      local_310->_M_string_length = 0;
      (local_310->field_2)._M_local_buf[0] = '\0';
      psVar9 = local_310;
    }
    else {
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"PRECOMPILE_HEADERS_REUSE_FROM","");
      local_2c8 = (string *)GetProperty(this,(string *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
      this_01 = this;
      if (local_2c8 != (string *)0x0) {
        this_01 = cmGlobalGenerator::FindGeneratorTarget
                            (this->LocalGenerator->GlobalGenerator,local_2c8);
      }
      GetSupportDirectory_abi_cxx11_(&local_2e8,this_01);
      local_298._0_8_ = local_2e8._M_string_length;
      local_298._8_8_ = local_2e8._M_dataplus._M_p;
      local_288._8_8_ = 10;
      local_278._M_p = "/cmake_pch";
      local_270 = (string *)0x0;
      views._M_len = 2;
      views._M_array = (iterator)local_298;
      local_288._M_allocated_capacity = (size_type)&local_2e8;
      cmCatViews((string *)local_350,views);
      local_318 = local_320 + 2;
      std::__cxx11::string::operator=((string *)local_318,(string *)local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      this_00 = this->Makefile;
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_LINK_PCH","");
      bVar1 = cmMakefile::IsOn(this_00,(string *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_allocated_capacity + 1));
      }
      local_2a0 = local_2c0._M_string_length;
      if (bVar1) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_298,(char (*) [2])0x92ddc0,(char (*) [3])0x9b2005);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                  (&local_258,(char (*) [4])0x9191b2,(char (*) [5])0x964d8c);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
                  (&local_218,(char (*) [5])"OBJC",(char (*) [3])0x904ebe);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[4],_true>
                  (local_1d8,(char (*) [7])"OBJCXX",(char (*) [4])0x91a30b);
        __l._M_len = 4;
        __l._M_array = (iterator)local_298;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_350,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2e8,(allocator_type *)&local_308);
        sVar7 = local_2a0;
        lVar6 = -0x100;
        paVar8 = &local_1d8[0].second.field_2;
        do {
          if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar8->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                            paVar8->_M_allocated_capacity + 1);
          }
          if (&paVar8->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar8->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar8->_M_allocated_capacity)[-6],
                            (&paVar8->_M_allocated_capacity)[-4] + 1);
          }
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar8->_M_allocated_capacity + -8);
          lVar6 = lVar6 + 0x40;
        } while (lVar6 != 0);
        if (arch->_M_string_length == 0) {
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
        }
        else {
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_298._8_8_ = "_";
          local_288._M_allocated_capacity = 0;
          local_278._M_p = (arch->_M_dataplus)._M_p;
          local_270 = (string *)0x0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_298;
          local_288._8_8_ = arch->_M_string_length;
          cmCatViews(&local_308,views_00);
        }
        destination = local_318;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_350,language);
        local_298._8_8_ = *(undefined8 *)(local_320 + 2);
        local_298._0_8_ = local_320[2]._M_parent;
        local_288._M_allocated_capacity = 0;
        local_288._8_8_ = local_308._M_string_length;
        local_278._M_p = local_308._M_dataplus._M_p;
        local_268._8_8_ = (pmVar4->_M_dataplus)._M_p;
        local_268._M_allocated_capacity = pmVar4->_M_string_length;
        local_258.first._M_dataplus._M_p = (pointer)0x0;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_298;
        local_270 = &local_308;
        cmCatViews(&local_2e8,views_02);
      }
      else {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[5],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_298,(char (*) [2])0x92ddc0,(char (*) [5])".h.c");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                  (&local_258,(char (*) [4])0x9191b2,(char (*) [9])".hxx.cxx");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[10],_true>
                  (&local_218,(char (*) [5])"OBJC",(char (*) [10])".objc.h.m");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                  (local_1d8,(char (*) [7])"OBJCXX",(char (*) [15])".objcxx.hxx.mm");
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)local_298;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_350,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2e8,(allocator_type *)&local_308);
        sVar7 = local_2a0;
        lVar6 = -0x100;
        paVar8 = &local_1d8[0].second.field_2;
        do {
          if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar8->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                            paVar8->_M_allocated_capacity + 1);
          }
          if (&paVar8->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar8->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar8->_M_allocated_capacity)[-6],
                            (&paVar8->_M_allocated_capacity)[-4] + 1);
          }
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar8->_M_allocated_capacity + -8);
          lVar6 = lVar6 + 0x40;
        } while (lVar6 != 0);
        if (arch->_M_string_length == 0) {
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
        }
        else {
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_298._8_8_ = "_";
          local_288._M_allocated_capacity = 0;
          local_278._M_p = (arch->_M_dataplus)._M_p;
          local_270 = (string *)0x0;
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_298;
          local_288._8_8_ = arch->_M_string_length;
          cmCatViews(&local_308,views_01);
        }
        destination = local_318;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_350,language);
        local_298._8_8_ = *(undefined8 *)(local_320 + 2);
        local_298._0_8_ = local_320[2]._M_parent;
        local_288._M_allocated_capacity = 0;
        local_288._8_8_ = local_308._M_string_length;
        local_278._M_p = local_308._M_dataplus._M_p;
        local_268._8_8_ = (pmVar4->_M_dataplus)._M_p;
        local_268._M_allocated_capacity = pmVar4->_M_string_length;
        local_258.first._M_dataplus._M_p = (pointer)0x0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)local_298;
        local_270 = &local_308;
        cmCatViews(&local_2e8,views_03);
      }
      std::__cxx11::string::operator=((string *)destination,(string *)&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      psVar9 = local_310;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_350);
      local_298._8_8_ = *(undefined8 *)(local_320 + 2);
      local_298._0_8_ = local_320[2]._M_parent;
      local_288._M_allocated_capacity = 0;
      local_288._8_8_ = 4;
      local_278._M_p = ".tmp";
      local_270 = (string *)0x0;
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_298;
      cmCatViews((string *)local_350,views_04);
      if (local_2c8 == (string *)0x0) {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_298,(string *)local_350,false,None);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"/* generated by CMake */\n",0x19);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        cmFileTimes::Copy(&local_2c0,(string *)local_350);
        cmSystemTools::MoveFileIfDifferent((string *)local_350,(string *)destination);
      }
      local_2c0._M_string_length = sVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_2c0._M_string_length == 0) {
      return psVar9;
    }
  }
  (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar9,*(long *)(local_320 + 2),
             (long)&(local_320[2]._M_parent)->_M_color + *(long *)(local_320 + 2));
  return psVar9;
}

Assistant:

std::string cmGeneratorTarget::GetPchSource(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchSources.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    if (pchHeader.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    const cmGeneratorTarget* generatorTarget = this;
    cmValue pchReuseFrom =
      generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename = cmStrCat(generatorTarget->GetSupportDirectory(), "/cmake_pch");

    // For GCC the source extension will be transformed into .h[xx].gch
    if (!this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".h.c" },
        { "CXX", ".hxx.cxx" },
        { "OBJC", ".objc.h.m" },
        { "OBJCXX", ".objcxx.hxx.mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    } else {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".c" }, { "CXX", ".cxx" }, { "OBJC", ".m" }, { "OBJCXX", ".mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    }

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      {
        cmGeneratedFileStream file(filename_tmp);
        file << "/* generated by CMake */\n";
      }
      cmFileTimes::Copy(pchHeader, filename_tmp);
      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}